

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

int nn_ep_init(nn_ep *self,int src,nn_sock *sock,int eid,nn_transport *transport,int bind,char *addr
              )

{
  int iVar1;
  size_t sVar2;
  int local_40;
  int rc;
  int bind_local;
  nn_transport *transport_local;
  int eid_local;
  nn_sock *sock_local;
  int src_local;
  nn_ep *self_local;
  
  nn_fsm_init(&self->fsm,nn_ep_handler,nn_ep_shutdown,src,self,&sock->fsm);
  self->state = 1;
  self->sock = sock;
  self->eid = eid;
  self->last_errno = 0;
  nn_list_item_init(&self->item);
  iVar1 = (sock->ep_template).rcvprio;
  (self->options).sndprio = (sock->ep_template).sndprio;
  (self->options).rcvprio = iVar1;
  (self->options).ipv4only = (sock->ep_template).ipv4only;
  sVar2 = strlen(addr);
  if (0x80 < sVar2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (addr) <= NN_SOCKADDR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/ep.c",0x41
           );
    fflush(_stderr);
    nn_err_abort();
  }
  strcpy(self->addr,addr);
  if (bind == 0) {
    local_40 = (*transport->connect)(self);
  }
  else {
    local_40 = (*transport->bind)(self);
  }
  if (local_40 < 0) {
    nn_list_item_term(&self->item);
    nn_fsm_term(&self->fsm);
    self_local._4_4_ = local_40;
  }
  else {
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int nn_ep_init (struct nn_ep *self, int src, struct nn_sock *sock, int eid,
    const struct nn_transport *transport, int bind, const char *addr)
{
    int rc;

    nn_fsm_init (&self->fsm, nn_ep_handler, nn_ep_shutdown,
        src, self, &sock->fsm);
    self->state = NN_EP_STATE_IDLE;

    self->sock = sock;
    self->eid = eid;
    self->last_errno = 0;
    nn_list_item_init (&self->item);
    memcpy (&self->options, &sock->ep_template, sizeof(struct nn_ep_options));

    /*  Store the textual form of the address. */
    nn_assert (strlen (addr) <= NN_SOCKADDR_MAX);
    strcpy (self->addr, addr);

    /*  Create transport-specific part of the endpoint. */
    if (bind)
        rc = transport->bind (self);
    else
        rc = transport->connect (self);

    /*  Endpoint creation failed. */
    if (rc < 0) {
        nn_list_item_term (&self->item);
        nn_fsm_term (&self->fsm);
        return rc;
    }

    return 0;
}